

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::ProgressUpdateEvent>::construct
          (BasicTypeInfo<dap::ProgressUpdateEvent> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::ProgressUpdateEvent> *this_local;
  
  memset(ptr,0,0x58);
  ProgressUpdateEvent::ProgressUpdateEvent((ProgressUpdateEvent *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }